

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O3

void loadJSONData(QMultiHash<char,_QLatin1String> *types,QMultiHash<char,_QLatin1String> *keywords,
                 QMultiHash<char,_QLatin1String> *builtin,QMultiHash<char,_QLatin1String> *literals,
                 QMultiHash<char,_QLatin1String> *other)

{
  if (jsonDataInitialized == '\0') {
    initJSONData();
    jsonDataInitialized = '\x01';
  }
  QMultiHash<char,_QLatin1String>::operator=(types,&json_types);
  QMultiHash<char,_QLatin1String>::operator=(keywords,&json_keywords);
  QMultiHash<char,_QLatin1String>::operator=(builtin,&json_builtin);
  QMultiHash<char,_QLatin1String>::operator=(literals,&json_literals);
  QMultiHash<char,_QLatin1String>::operator=(other,&json_other);
  return;
}

Assistant:

void loadJSONData(QMultiHash<char, QLatin1String> &types,
                  QMultiHash<char, QLatin1String> &keywords,
                  QMultiHash<char, QLatin1String> &builtin,
                  QMultiHash<char, QLatin1String> &literals,
                  QMultiHash<char, QLatin1String> &other) {
    if (!jsonDataInitialized) {
        initJSONData();
        jsonDataInitialized = true;
    }
    types = json_types;
    keywords = json_keywords;
    builtin = json_builtin;
    literals = json_literals;
    other = json_other;
}